

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O1

string * __thiscall
BtorSimVCDWriter::get_am_identifier
          (string *__return_storage_ptr__,BtorSimVCDWriter *this,int64_t id,string *idx)

{
  map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  BtorSimBitVector *bv;
  iterator iVar4;
  long *plVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  long *plVar8;
  size_type *psVar9;
  _Alloc_hider _Var10;
  ulong __val;
  uint __len;
  pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> key;
  string local_d8;
  key_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  bv = btorsim_bv_char_to_bv((idx->_M_dataplus)._M_p);
  btorsim_bv_to_hex_string_abi_cxx11_(&local_d8,bv);
  local_b8.second._M_dataplus._M_p = (pointer)&local_b8.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    local_b8.second.field_2._8_8_ = local_d8.field_2._8_8_;
  }
  else {
    local_b8.second._M_dataplus._M_p = local_d8._M_dataplus._M_p;
  }
  local_b8.second._M_string_length = local_d8._M_string_length;
  local_b8.first = id;
  btorsim_bv_free(bv);
  this_00 = &this->am_identifiers;
  iVar4 = std::
          _Rb_tree<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_b8);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->am_identifiers)._M_t._M_impl.super__Rb_tree_header
     ) {
    if (this->readable_vcd == true) {
      __val = -id;
      if (0 < id) {
        __val = id;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = __val;
        uVar3 = 4;
        do {
          __len = uVar3;
          if (uVar7 < 100) {
            __len = __len - 2;
            goto LAB_0010b217;
          }
          if (uVar7 < 1000) {
            __len = __len - 1;
            goto LAB_0010b217;
          }
          if (uVar7 < 10000) goto LAB_0010b217;
          bVar2 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          uVar3 = __len + 4;
        } while (bVar2);
        __len = __len + 1;
      }
LAB_0010b217:
      local_90[0] = &local_80;
      std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)(id >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_90[0]->_M_local_buf + -(id >> 0x3f),__len,__val);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x116f9c);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_40 = *plVar8;
        lStack_38 = plVar5[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar8;
        local_50 = (long *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)local_b8.second._M_dataplus._M_p);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_d8.field_2._M_allocated_capacity = *psVar9;
        local_d8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar9;
        local_d8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_d8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pmVar6 = std::
               map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_b8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      _Var10._M_p = (pointer)local_90[0];
      if (local_90[0] == &local_80) goto LAB_0010b1c4;
    }
    else {
      generate_next_identifier_abi_cxx11_(&local_d8,this);
      pmVar6 = std::
               map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_b8);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_d8);
      _Var10._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0010b1c4;
    }
    operator_delete(_Var10._M_p);
  }
LAB_0010b1c4:
  pmVar6 = std::
           map<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pmVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.second._M_dataplus._M_p != &local_b8.second.field_2) {
    operator_delete(local_b8.second._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
BtorSimVCDWriter::get_am_identifier (int64_t id, std::string idx)
{
  BtorSimBitVector* bv_idx = btorsim_bv_char_to_bv (idx.c_str ());
  auto key = std::make_pair (id, btorsim_bv_to_hex_string (bv_idx));
  btorsim_bv_free (bv_idx);
  if (am_identifiers.find (key) == am_identifiers.end ())
  {
    if (readable_vcd)
    {
      am_identifiers[key] = "n" + std::to_string (id) + "@" + key.second;
    }
    else
      am_identifiers[key] = generate_next_identifier ();
  }
  return am_identifiers[key];
}